

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort.h
# Opt level: O0

void Glucose::selectionSort<unsigned_int,Glucose::reduceDB_lt>(uint *array,int size,reduceDB_lt lt)

{
  undefined4 uVar1;
  bool bVar2;
  reduceDB_lt *in_RDX;
  int in_ESI;
  long in_RDI;
  uint tmp;
  int best_i;
  int j;
  int i;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  
  for (local_18 = 0; local_18 < in_ESI + -1; local_18 = local_18 + 1) {
    local_20 = local_18;
    local_1c = local_18;
    while (local_1c = local_1c + 1, local_1c < in_ESI) {
      bVar2 = reduceDB_lt::operator()(in_RDX,(CRef)((ulong)in_RDI >> 0x20),(CRef)in_RDI);
      if (bVar2) {
        local_20 = local_1c;
      }
    }
    uVar1 = *(undefined4 *)(in_RDI + (long)local_18 * 4);
    *(undefined4 *)(in_RDI + (long)local_18 * 4) = *(undefined4 *)(in_RDI + (long)local_20 * 4);
    *(undefined4 *)(in_RDI + (long)local_20 * 4) = uVar1;
  }
  return;
}

Assistant:

void selectionSort(T* array, int size, LessThan lt)
{
    int     i, j, best_i;
    T       tmp;

    for (i = 0; i < size-1; i++){
        best_i = i;
        for (j = i+1; j < size; j++){
            if (lt(array[j], array[best_i]))
                best_i = j;
        }
        tmp = array[i]; array[i] = array[best_i]; array[best_i] = tmp;
    }
}